

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_stalker.cpp
# Opt level: O1

int AF_A_StalkerAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  FState *newstate;
  VMValue *pVVar9;
  AActor *pAVar10;
  char *__assertion;
  bool bVar11;
  FName local_38;
  FName local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005cffa5;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = *(AActor **)&param->field_0;
    pVVar9 = param;
    uVar5 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (this->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar5 = (uint)bVar11;
      pVVar9 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar11);
      if (pPVar8 != pPVar3 && !bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005cffa5;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005cff7a;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005cffa5;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if (((this->flags).Value & 0x200) == 0) {
        pAVar10 = (this->target).field_0.p;
        if (pAVar10 != (AActor *)0x0) {
          if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            A_FaceTarget(this);
            bVar11 = AActor::CheckMeleeRange(this);
            if (bVar11) {
              uVar5 = FRandom::GenRand32(&pr_stalker);
              iVar4 = (uVar5 & 7) * 2 + 2;
              pAVar10 = (this->target).field_0.p;
              if ((pAVar10 != (AActor *)0x0) &&
                 (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (this->target).field_0.p = (AActor *)0x0;
                pAVar10 = (AActor *)0x0;
              }
              local_38.Index = 0x84;
              local_30.Degrees = 0.0;
              iVar6 = P_DamageMobj(pAVar10,this,this,iVar4,&local_38,0,&local_30);
              if (0 < iVar6) {
                iVar4 = iVar6;
              }
              pAVar10 = (this->target).field_0.p;
              if ((pAVar10 != (AActor *)0x0) &&
                 (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (this->target).field_0.p = (AActor *)0x0;
                pAVar10 = (AActor *)0x0;
              }
              P_TraceBleed(iVar4,pAVar10,this);
            }
          }
          else {
            (this->target).field_0.p = (AActor *)0x0;
          }
        }
      }
      else {
        local_34.Index = FName::NameManager::FindName(&FName::NameData,"Drop",false);
        newstate = AActor::FindState(this,&local_34);
        AActor::SetState(this,newstate,false);
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005cff7a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005cffa5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                ,0x3c,"int AF_A_StalkerAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_StalkerAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->flags & MF_NOGRAVITY)
	{
		self->SetState (self->FindState("Drop"));
	}
	else if (self->target != NULL)
	{
		A_FaceTarget (self);
		if (self->CheckMeleeRange ())
		{
			int damage = (pr_stalker() & 7) * 2 + 2;

			int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		}
	}
	return 0;
}